

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

string * pbrt::ReadFileContents(string *__return_storage_ptr__,string *filename)

{
  undefined8 uVar1;
  int in_stack_fffffffffffffdbc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  ifstream ifs;
  byte abStack_200 [200];
  undefined8 auStack_138 [36];
  
  std::ifstream::ifstream(&ifs,(string *)filename,_S_bin);
  if ((abStack_200[*(long *)(_ifs + -0x18)] & 5) == 0) {
    uVar1 = *(undefined8 *)((long)auStack_138 + *(long *)(_ifs + -0x18));
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)__return_storage_ptr__,uVar1,0xffffffffffffffff,0,0xffffffff);
    std::ifstream::~ifstream(&ifs);
    return __return_storage_ptr__;
  }
  LastError();
  ErrorString_abi_cxx11_(in_stack_fffffffffffffdbc);
  ErrorExit<std::__cxx11::string_const&,std::__cxx11::string>("%s: %s",filename,&local_240);
}

Assistant:

std::string ReadFileContents(const std::string &filename) {
    std::ifstream ifs(filename, std::ios::binary);
    if (!ifs)
        ErrorExit("%s: %s", filename, ErrorString());
    return std::string((std::istreambuf_iterator<char>(ifs)),
                       (std::istreambuf_iterator<char>()));
}